

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O2

int InitPlatform(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  GLFWmonitor *monitor;
  GLFWmonitor **ppGVar4;
  GLFWvidmode *pGVar5;
  ulong uVar6;
  ulong uVar7;
  char (*__dest) [64];
  int iVar8;
  char *pcVar9;
  int i;
  uint uVar10;
  long lVar11;
  uint uVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int fbHeight;
  int count;
  undefined4 uStack_84;
  long lStack_80;
  undefined1 local_78 [16];
  int monitorHeight;
  int monitorWidth;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  glfwSetErrorCallback(ErrorCallback);
  iVar2 = glfwInit();
  if (iVar2 == 0) {
    pcVar9 = "GLFW: Failed to initialize GLFW";
  }
  else {
    glfwDefaultWindowHints();
    glfwWindowHint(0x20006,0);
    if ((CORE.Window.flags & 2) != 0) {
      CORE.Window.fullscreen = true;
    }
    glfwWindowHint(0x20004,(uint)(-1 < (char)CORE.Window.flags));
    glfwWindowHint(0x20005,(uint)((CORE.Window.flags & 8) == 0));
    glfwWindowHint(0x20003,CORE.Window.flags >> 2 & 1);
    uVar3 = CORE.Window.flags;
    if ((CORE.Window.flags & 0x600) != 0) {
      CORE.Window.flags = CORE.Window.flags & 0xfffff9ff;
    }
    glfwWindowHint(0x20001,(uint)((uVar3 >> 0xb & 1) == 0));
    glfwWindowHint(0x20007,CORE.Window.flags >> 0xc & 1);
    glfwWindowHint(0x2000a,CORE.Window.flags >> 4 & 1);
    glfwWindowHint(0x2200c,CORE.Window.flags >> 0xd & 1);
    glfwWindowHint(0x2000d,CORE.Window.flags >> 0xe & 1);
    if ((CORE.Window.flags & 0x20) != 0) {
      TraceLog(3,"DISPLAY: Trying to enable MSAA x4");
      glfwWindowHint(0x2100d,4);
    }
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,3);
    glfwWindowHint(0x22008,0x32001);
    glfwWindowHint(0x22006,0);
    glfwSetJoystickCallback((GLFWjoystickfun)0x0);
    uVar10 = CORE.Window.screen.height;
    uVar3 = CORE.Window.screen.width;
    if (CORE.Window.fullscreen == true) {
      monitor = glfwGetPrimaryMonitor();
      if (monitor == (GLFWmonitor *)0x0) {
        pcVar9 = "GLFW: Failed to get primary monitor";
      }
      else {
        SetDimensionsFromMonitor(monitor);
        if (CORE.Window.screen.width == CORE.Window.display.width &&
            CORE.Window.screen.height == CORE.Window.display.height) {
          CORE.Window.position.x = CORE.Window.display.width >> 2;
          CORE.Window.position.y = CORE.Window.screen.height >> 2;
        }
        else {
          CORE.Window.position.y =
               (CORE.Window.display.height >> 1) - (CORE.Window.screen.height >> 1);
          CORE.Window.position.x =
               (CORE.Window.display.width >> 1) - (CORE.Window.screen.width >> 1);
          if (CORE.Window.position.x < 0) {
            CORE.Window.position.x = 0;
          }
          if (CORE.Window.position.y < 0) {
            CORE.Window.position.y = 0;
          }
        }
        _count = _count & 0xffffffff00000000;
        pGVar5 = glfwGetVideoModes(monitor,&count);
        uVar6 = 0;
        uVar7 = _count & 0xffffffff;
        if (count < 1) {
          uVar7 = uVar6;
        }
        for (; uVar7 * 0x18 - uVar6 != 0; uVar6 = uVar6 + 0x18) {
          uVar3 = *(uint *)((long)&pGVar5->width + uVar6);
          if ((CORE.Window.screen.width <= uVar3) &&
             (CORE.Window.screen.height <= *(uint *)((long)&pGVar5->height + uVar6))) {
            CORE.Window.display.height = *(uint *)((long)&pGVar5->height + uVar6);
            CORE.Window.display.width = uVar3;
            break;
          }
        }
        TraceLog(3,"SYSTEM: Closest fullscreen videomode: %i x %i",(ulong)CORE.Window.display.width,
                 (ulong)CORE.Window.display.height);
        if (CORE.Window.display.height < CORE.Window.screen.height ||
            CORE.Window.display.width < CORE.Window.screen.width) {
          iVar2 = 0;
          TraceLog(4,
                   "DISPLAY: Downscaling required: Screen size (%ix%i) is bigger than display size (%ix%i)"
                  );
          uVar3 = CORE.Window.display.width;
          local_48 = CONCAT44(CORE.Window.display.height,CORE.Window.display.width);
          auVar19._0_4_ =
               (float)((double)((ulong)CORE.Window.display.width | 0x4330000000000000) -
                      4503599627370496.0);
          auVar19._4_4_ =
               (float)((double)((ulong)CORE.Window.display.height | 0x4330000000000000) -
                      4503599627370496.0);
          auVar19._8_8_ = 0;
          auVar15._0_4_ =
               (float)((double)((ulong)CORE.Window.screen.width | 0x4330000000000000) -
                      4503599627370496.0);
          auVar15._4_4_ =
               (float)((double)((ulong)CORE.Window.screen.height | 0x4330000000000000) -
                      4503599627370496.0);
          auVar15._8_8_ = 0;
          local_78 = divps(auVar19,auVar15);
          fVar13 = local_78._4_4_;
          local_58 = CORE.Window.display.height;
          uStack_54 = CORE.Window.display.height;
          uStack_50 = CORE.Window.display.height;
          uStack_4c = CORE.Window.display.height;
          uStack_40 = 0;
          if (local_78._0_4_ <= fVar13) {
            fVar13 = roundf(auVar15._4_4_ * local_78._0_4_);
            CORE.Window.renderOffset.y = local_58 - (int)fVar13;
            auVar17 = local_78;
          }
          else {
            local_78 = auVar15;
            fVar13 = roundf(fVar13 * auVar15._0_4_);
            auVar17._4_12_ = auVar15._4_12_;
            iVar2 = uVar3 - (int)fVar13;
            auVar17._0_4_ = (float)(uint)(int)fVar13 / (float)local_78._0_4_;
            CORE.Window.renderOffset.y = 0;
          }
          CORE.Window.renderOffset.x = iVar2;
          CORE.Window.screenScale.m0 = auVar17._0_4_;
          CORE.Window.screenScale._4_12_ = ZEXT812(0);
          CORE.Window.screenScale.m1 = 0;
          CORE.Window.screenScale.m10 = 1.0;
          CORE.Window.screenScale.m15 = 1.0;
          CORE.Window.render.height = local_58;
          CORE.Window.render.width = (uint)local_48;
          CORE.Window.screenScale.m5 = CORE.Window.screenScale.m0;
          CORE.Window.screenScale._24_16_ = CORE.Window.screenScale._4_16_;
          CORE.Window.screenScale._44_16_ = CORE.Window.screenScale._4_16_;
          TraceLog(4,"DISPLAY: Downscale matrix generated, content will be rendered at (%ix%i)",
                   uVar3,(ulong)local_58);
          uVar3 = CORE.Window.display.width;
          uVar10 = CORE.Window.display.height;
        }
        else if (CORE.Window.screen.width < CORE.Window.display.width ||
                 CORE.Window.screen.height < CORE.Window.display.height) {
          TraceLog(3,
                   "DISPLAY: Upscaling required: Screen size (%ix%i) smaller than display size (%ix%i)"
                  );
          uVar10 = CORE.Window.display.height;
          uVar3 = CORE.Window.display.width;
          if (CORE.Window.screen.height == 0 || CORE.Window.screen.width == 0) {
            CORE.Window.screen.width = CORE.Window.display.width;
            CORE.Window.screen.height = CORE.Window.display.height;
          }
          uVar1 = CORE.Window.screen.height;
          uVar12 = CORE.Window.screen.width;
          fVar13 = (float)CORE.Window.display.width / (float)CORE.Window.display.height;
          if (fVar13 <= (float)CORE.Window.screen.width / (float)CORE.Window.screen.height) {
            fVar13 = roundf((float)CORE.Window.screen.width / fVar13);
            CORE.Window.render.height = (uint)fVar13;
            CORE.Window.renderOffset.y = CORE.Window.render.height - uVar1;
            CORE.Window.renderOffset.x = 0;
          }
          else {
            fVar13 = roundf(fVar13 * (float)CORE.Window.screen.height);
            CORE.Window.renderOffset.x = (int)fVar13 - uVar12;
            CORE.Window.renderOffset.y = 0;
            uVar12 = (int)fVar13;
            CORE.Window.render.height = uVar1;
          }
          CORE.Window.render.width = uVar12;
        }
        else {
          CORE.Window.render.height = CORE.Window.screen.height;
          CORE.Window.render.width = CORE.Window.screen.width;
          CORE.Window.renderOffset.x = 0;
          CORE.Window.renderOffset.y = 0;
          uVar3 = CORE.Window.display.width;
          uVar10 = CORE.Window.display.height;
        }
        pcVar9 = " ";
        if (CORE.Window.title != (char *)0x0) {
          pcVar9 = CORE.Window.title;
        }
        platform.handle = glfwCreateWindow(uVar3,uVar10,pcVar9,monitor,(GLFWwindow *)0x0);
LAB_0015c3f7:
        if (platform.handle != (GLFWwindow *)0x0) {
          glfwMakeContextCurrent(platform.handle);
          uVar3 = glfwGetError((char **)0x0);
          if ((uVar3 & 0xfffffffd) == 0x10008) {
            pcVar9 = "PLATFORM: Failed to initialize graphics device";
          }
          else {
            CORE.Window.ready = true;
            glfwSwapInterval(0);
            if ((CORE.Window.flags & 0x40) != 0) {
              glfwSwapInterval(1);
              TraceLog(3,"DISPLAY: Trying to enable VSYNC");
            }
            _count = CONCAT44(uStack_84,CORE.Window.screen.width);
            fbHeight = CORE.Window.screen.height;
            uVar3 = CORE.Window.screen.width;
            if ((CORE.Window.flags >> 0xd & 1) != 0) {
              glfwGetFramebufferSize(platform.handle,&count,&fbHeight);
              CORE.Window.screenScale._4_12_ = ZEXT812(0);
              CORE.Window.screenScale.m1 = 0;
              CORE.Window.screenScale.m10 = 1.0;
              CORE.Window.screenScale.m15 = 1.0;
              auVar16._0_4_ = (float)count;
              auVar16._4_4_ = (float)fbHeight;
              auVar16._8_8_ = 0;
              auVar18._4_4_ = 0;
              auVar18._0_4_ = CORE.Window.screen.width;
              auVar18._8_4_ = CORE.Window.screen.height;
              auVar18._12_4_ = 0;
              auVar14._0_4_ = (float)(SUB168(auVar18 | _DAT_001bf820,0) - (double)DAT_001bf820);
              auVar14._4_4_ = (float)(SUB168(auVar18 | _DAT_001bf820,8) - DAT_001bf820._8_8_);
              auVar14._8_8_ = 0;
              CORE.Window.screenScale.m0 = auVar16._0_4_ / auVar14._0_4_;
              auVar15 = divps(auVar14,auVar16);
              CORE.Window.screenScale.m5 = auVar16._4_4_ / auVar14._4_4_;
              CORE.Input.Mouse.scale = auVar15._0_8_;
              uVar3 = count;
              CORE.Window.screenScale._24_16_ = CORE.Window.screenScale._4_16_;
              CORE.Window.screenScale._44_16_ = CORE.Window.screenScale._4_16_;
            }
            CORE.Window.render.height = fbHeight;
            CORE.Window.render.width = uVar3;
            CORE.Window.currentFbo.width = uVar3;
            CORE.Window.currentFbo.height = fbHeight;
            TraceLog(3,"DISPLAY: Device initialized successfully");
            TraceLog(3,"    > Display size: %i x %i",(ulong)CORE.Window.display.width,
                     (ulong)CORE.Window.display.height);
            TraceLog(3,"    > Screen size:  %i x %i",(ulong)CORE.Window.screen.width,
                     (ulong)CORE.Window.screen.height);
            TraceLog(3,"    > Render size:  %i x %i",(ulong)CORE.Window.render & 0xffffffff,
                     (ulong)CORE.Window.render >> 0x20);
            TraceLog(3,"    > Viewport offsets: %i, %i",(ulong)CORE.Window.renderOffset & 0xffffffff
                     ,(ulong)CORE.Window.renderOffset >> 0x20);
            if ((CORE.Window.flags & 0x200) != 0) {
              MinimizeWindow();
            }
            if (CORE.Window.ready != false) {
              _count = _count & 0xffffffff00000000;
              fbHeight = 0;
              monitorWidth = 0;
              monitorHeight = 0;
              glfwGetMonitorWorkarea(monitor,&count,&fbHeight,&monitorWidth,&monitorHeight);
              iVar2 = (int)(monitorHeight - CORE.Window.render.height) / 2 + fbHeight;
              iVar8 = 0;
              if (-2 < (int)(monitorWidth - CORE.Window.render.width)) {
                iVar8 = (int)(monitorWidth - CORE.Window.render.width) / 2;
              }
              iVar8 = iVar8 + count;
              if (iVar2 <= fbHeight) {
                iVar2 = fbHeight;
              }
              SetWindowPosition(iVar8,iVar2);
              CORE.Window.position.x = iVar8;
              CORE.Window.position.y = iVar2;
              rlLoadExtensions(glfwGetProcAddress);
              glfwSetWindowSizeCallback(platform.handle,WindowSizeCallback);
              glfwSetWindowPosCallback(platform.handle,WindowPosCallback);
              glfwSetWindowMaximizeCallback(platform.handle,WindowMaximizeCallback);
              glfwSetWindowIconifyCallback(platform.handle,WindowIconifyCallback);
              glfwSetWindowFocusCallback(platform.handle,WindowFocusCallback);
              glfwSetDropCallback(platform.handle,WindowDropCallback);
              if ((CORE.Window.flags & 0x2000) != 0) {
                glfwSetWindowContentScaleCallback(platform.handle,WindowContentScaleCallback);
              }
              glfwSetKeyCallback(platform.handle,KeyCallback);
              glfwSetCharCallback(platform.handle,CharCallback);
              glfwSetMouseButtonCallback(platform.handle,MouseButtonCallback);
              glfwSetCursorPosCallback(platform.handle,MouseCursorPosCallback);
              glfwSetScrollCallback(platform.handle,MouseScrollCallback);
              glfwSetCursorEnterCallback(platform.handle,CursorEnterCallback);
              glfwSetJoystickCallback(JoystickCallback);
              glfwSetInputMode(platform.handle,0x33004,1);
              __dest = CORE.Input.Gamepad.name;
              for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
                iVar2 = glfwJoystickPresent((int)lVar11);
                if (iVar2 != 0) {
                  pcVar9 = glfwGetJoystickName((int)lVar11);
                  strcpy(*__dest,pcVar9);
                }
                __dest = __dest + 1;
              }
              _count = 0;
              lStack_80 = 0;
              iVar2 = clock_gettime(1,(timespec *)&count);
              if (iVar2 == 0) {
                CORE.Time.base = _count * 1000000000 + lStack_80;
              }
              else {
                TraceLog(4,"TIMER: Hi-resolution timer not available");
              }
              CORE.Time.previous = glfwGetTime();
              CORE.Storage.basePath = GetWorkingDirectory();
              iVar2 = glfwGetPlatform();
              if (iVar2 - 0x60001U < 5) {
                pcVar9 = &DAT_001c0bec + *(int *)(&DAT_001c0bec + (ulong)(iVar2 - 0x60001U) * 4);
              }
              else {
                pcVar9 = "";
              }
              TraceLog(3,"PLATFORM: DESKTOP (GLFW - %s): Initialized successfully",pcVar9);
              return 0;
            }
            pcVar9 = "PLATFORM: Failed to initialize graphic device";
          }
          iVar2 = 6;
          goto LAB_0015c42c;
        }
        glfwTerminate();
        pcVar9 = "GLFW: Failed to initialize Window";
      }
    }
    else {
      pcVar9 = " ";
      if (CORE.Window.title != (char *)0x0) {
        pcVar9 = CORE.Window.title;
      }
      platform.handle =
           glfwCreateWindow(CORE.Window.screen.width + (CORE.Window.screen.width == 0),
                            CORE.Window.screen.height + (CORE.Window.screen.height == 0),pcVar9,
                            (GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      _count = _count & 0xffffffff00000000;
      iVar2 = GetCurrentMonitor();
      ppGVar4 = glfwGetMonitors(&count);
      if (iVar2 < count) {
        monitor = ppGVar4[iVar2];
        SetDimensionsFromMonitor(monitor);
        if (uVar3 == 0 && uVar10 == 0) {
          glfwSetWindowSize(platform.handle,CORE.Window.screen.width,CORE.Window.screen.height);
        }
        if (platform.handle != (GLFWwindow *)0x0) {
          CORE.Window.render.height = CORE.Window.screen.height;
          CORE.Window.render.width = CORE.Window.screen.width;
        }
        goto LAB_0015c3f7;
      }
      glfwTerminate();
      pcVar9 = "GLFW: Failed to determine Monitor to center Window";
    }
  }
  iVar2 = 4;
LAB_0015c42c:
  TraceLog(iVar2,pcVar9);
  return -1;
}

Assistant:

int InitPlatform(void)
{
    glfwSetErrorCallback(ErrorCallback);
/*
    // TODO: Setup GLFW custom allocators to match raylib ones
    const GLFWallocator allocator = {
        .allocate = MemAlloc,
        .deallocate = MemFree,
        .reallocate = MemRealloc,
        .user = NULL
    };

    glfwInitAllocator(&allocator);
*/

#if defined(__APPLE__)
    glfwInitHint(GLFW_COCOA_CHDIR_RESOURCES, GLFW_FALSE);
#endif
    // Initialize GLFW internal global state
    int result = glfwInit();
    if (result == GLFW_FALSE) { TRACELOG(LOG_WARNING, "GLFW: Failed to initialize GLFW"); return -1; }

    // Initialize graphic device: display/window and graphic context
    //----------------------------------------------------------------------------
    glfwDefaultWindowHints();                       // Set default windows hints
    //glfwWindowHint(GLFW_RED_BITS, 8);             // Framebuffer red color component bits
    //glfwWindowHint(GLFW_GREEN_BITS, 8);           // Framebuffer green color component bits
    //glfwWindowHint(GLFW_BLUE_BITS, 8);            // Framebuffer blue color component bits
    //glfwWindowHint(GLFW_ALPHA_BITS, 8);           // Framebuffer alpha color component bits
    //glfwWindowHint(GLFW_DEPTH_BITS, 24);          // Depthbuffer bits
    //glfwWindowHint(GLFW_REFRESH_RATE, 0);         // Refresh rate for fullscreen window
    //glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_API); // OpenGL API to use. Alternative: GLFW_OPENGL_ES_API
    //glfwWindowHint(GLFW_AUX_BUFFERS, 0);          // Number of auxiliar buffers

    // Disable GlFW auto iconify behaviour
    // Auto Iconify automatically minimizes (iconifies) the window if the window loses focus
    // additionally auto iconify restores the hardware resolution of the monitor if the window that loses focus is a fullscreen window
    glfwWindowHint(GLFW_AUTO_ICONIFY, 0);

    // Check window creation flags
    if ((CORE.Window.flags & FLAG_FULLSCREEN_MODE) > 0) CORE.Window.fullscreen = true;

    if ((CORE.Window.flags & FLAG_WINDOW_HIDDEN) > 0) glfwWindowHint(GLFW_VISIBLE, GLFW_FALSE); // Visible window
    else glfwWindowHint(GLFW_VISIBLE, GLFW_TRUE);     // Window initially hidden

    if ((CORE.Window.flags & FLAG_WINDOW_UNDECORATED) > 0) glfwWindowHint(GLFW_DECORATED, GLFW_FALSE); // Border and buttons on Window
    else glfwWindowHint(GLFW_DECORATED, GLFW_TRUE);   // Decorated window

    if ((CORE.Window.flags & FLAG_WINDOW_RESIZABLE) > 0) glfwWindowHint(GLFW_RESIZABLE, GLFW_TRUE); // Resizable window
    else glfwWindowHint(GLFW_RESIZABLE, GLFW_FALSE);  // Avoid window being resizable

    // Disable FLAG_WINDOW_MINIMIZED, not supported on initialization
    if ((CORE.Window.flags & FLAG_WINDOW_MINIMIZED) > 0) CORE.Window.flags &= ~FLAG_WINDOW_MINIMIZED;

    // Disable FLAG_WINDOW_MAXIMIZED, not supported on initialization
    if ((CORE.Window.flags & FLAG_WINDOW_MAXIMIZED) > 0) CORE.Window.flags &= ~FLAG_WINDOW_MAXIMIZED;

    if ((CORE.Window.flags & FLAG_WINDOW_UNFOCUSED) > 0) glfwWindowHint(GLFW_FOCUSED, GLFW_FALSE);
    else glfwWindowHint(GLFW_FOCUSED, GLFW_TRUE);

    if ((CORE.Window.flags & FLAG_WINDOW_TOPMOST) > 0) glfwWindowHint(GLFW_FLOATING, GLFW_TRUE);
    else glfwWindowHint(GLFW_FLOATING, GLFW_FALSE);

    // NOTE: Some GLFW flags are not supported on HTML5
    if ((CORE.Window.flags & FLAG_WINDOW_TRANSPARENT) > 0) glfwWindowHint(GLFW_TRANSPARENT_FRAMEBUFFER, GLFW_TRUE);     // Transparent framebuffer
    else glfwWindowHint(GLFW_TRANSPARENT_FRAMEBUFFER, GLFW_FALSE);  // Opaque framebuffer

    if ((CORE.Window.flags & FLAG_WINDOW_HIGHDPI) > 0)
    {
        // Resize window content area based on the monitor content scale.
        // NOTE: This hint only has an effect on platforms where screen coordinates and pixels always map 1:1 such as Windows and X11.
        // On platforms like macOS the resolution of the framebuffer is changed independently of the window size.
        glfwWindowHint(GLFW_SCALE_TO_MONITOR, GLFW_TRUE);   // Scale content area based on the monitor content scale where window is placed on
#if defined(__APPLE__)
        glfwWindowHint(GLFW_COCOA_RETINA_FRAMEBUFFER, GLFW_TRUE);
#endif
    }
    else glfwWindowHint(GLFW_SCALE_TO_MONITOR, GLFW_FALSE);

    // Mouse passthrough
    if ((CORE.Window.flags & FLAG_WINDOW_MOUSE_PASSTHROUGH) > 0) glfwWindowHint(GLFW_MOUSE_PASSTHROUGH, GLFW_TRUE);
    else glfwWindowHint(GLFW_MOUSE_PASSTHROUGH, GLFW_FALSE);

    if (CORE.Window.flags & FLAG_MSAA_4X_HINT)
    {
        // NOTE: MSAA is only enabled for main framebuffer, not user-created FBOs
        TRACELOG(LOG_INFO, "DISPLAY: Trying to enable MSAA x4");
        glfwWindowHint(GLFW_SAMPLES, 4);   // Tries to enable multisampling x4 (MSAA), default is 0
    }

    // NOTE: When asking for an OpenGL context version, most drivers provide the highest supported version
    // with backward compatibility to older OpenGL versions.
    // For example, if using OpenGL 1.1, driver can provide a 4.3 backwards compatible context.

    // Check selection OpenGL version
    if (rlGetVersion() == RL_OPENGL_21)
    {
        glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);          // Choose OpenGL major version (just hint)
        glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 1);          // Choose OpenGL minor version (just hint)
    }
    else if (rlGetVersion() == RL_OPENGL_33)
    {
        glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);          // Choose OpenGL major version (just hint)
        glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);          // Choose OpenGL minor version (just hint)
        glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE); // Profiles Hint: Only 3.3 and above!
                                                                       // Values: GLFW_OPENGL_CORE_PROFILE, GLFW_OPENGL_ANY_PROFILE, GLFW_OPENGL_COMPAT_PROFILE
#if defined(__APPLE__)
        glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GLFW_TRUE);  // OSX Requires forward compatibility
#else
        glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GLFW_FALSE); // Forward Compatibility Hint: Only 3.3 and above!
#endif
        //glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GLFW_TRUE); // Request OpenGL DEBUG context
    }
    else if (rlGetVersion() == RL_OPENGL_43)
    {
        glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);          // Choose OpenGL major version (just hint)
        glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);          // Choose OpenGL minor version (just hint)
        glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
        glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GLFW_FALSE);
#if defined(RLGL_ENABLE_OPENGL_DEBUG_CONTEXT)
        glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GLFW_TRUE);   // Enable OpenGL Debug Context
#endif
    }
    else if (rlGetVersion() == RL_OPENGL_ES_20)                 // Request OpenGL ES 2.0 context
    {
        glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
        glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);
        glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_ES_API);
        glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_EGL_CONTEXT_API);
    }
    else if (rlGetVersion() == RL_OPENGL_ES_30)                 // Request OpenGL ES 3.0 context
    {
        glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
        glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);
        glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_ES_API);
        glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_EGL_CONTEXT_API);
    }

    // NOTE: GLFW 3.4+ defers initialization of the Joystick subsystem on the first call to any Joystick related functions.
    // Forcing this initialization here avoids doing it on PollInputEvents() called by EndDrawing() after first frame has been just drawn.
    // The initialization will still happen and possible delays still occur, but before the window is shown, which is a nicer experience.
    // REF: https://github.com/raysan5/raylib/issues/1554
    glfwSetJoystickCallback(NULL);

    GLFWmonitor *monitor = NULL;
    if (CORE.Window.fullscreen)
    {
        // According to glfwCreateWindow(), if the user does not have a choice, fullscreen applications
        // should default to the primary monitor.

        monitor = glfwGetPrimaryMonitor();
        if (!monitor)
        {
          TRACELOG(LOG_WARNING, "GLFW: Failed to get primary monitor");
          return -1;
        }

        SetDimensionsFromMonitor(monitor);

        // Remember center for switching from fullscreen to window
        if ((CORE.Window.screen.height == CORE.Window.display.height) && (CORE.Window.screen.width == CORE.Window.display.width))
        {
            // If screen width/height equal to the display, we can't calculate the window pos for toggling full-screened/windowed.
            // Toggling full-screened/windowed with pos(0, 0) can cause problems in some platforms, such as X11.
            CORE.Window.position.x = CORE.Window.display.width/4;
            CORE.Window.position.y = CORE.Window.display.height/4;
        }
        else
        {
            CORE.Window.position.x = CORE.Window.display.width/2 - CORE.Window.screen.width/2;
            CORE.Window.position.y = CORE.Window.display.height/2 - CORE.Window.screen.height/2;
        }

        if (CORE.Window.position.x < 0) CORE.Window.position.x = 0;
        if (CORE.Window.position.y < 0) CORE.Window.position.y = 0;

        // Obtain recommended CORE.Window.display.width/CORE.Window.display.height from a valid videomode for the monitor
        int count = 0;
        const GLFWvidmode *modes = glfwGetVideoModes(monitor, &count);

        // Get closest video mode to desired CORE.Window.screen.width/CORE.Window.screen.height
        for (int i = 0; i < count; i++)
        {
            if ((unsigned int)modes[i].width >= CORE.Window.screen.width)
            {
                if ((unsigned int)modes[i].height >= CORE.Window.screen.height)
                {
                    CORE.Window.display.width = modes[i].width;
                    CORE.Window.display.height = modes[i].height;
                    break;
                }
            }
        }

        TRACELOG(LOG_INFO, "SYSTEM: Closest fullscreen videomode: %i x %i", CORE.Window.display.width, CORE.Window.display.height);

        // NOTE: ISSUE: Closest videomode could not match monitor aspect-ratio, for example,
        // for a desired screen size of 800x450 (16:9), closest supported videomode is 800x600 (4:3),
        // framebuffer is rendered correctly but once displayed on a 16:9 monitor, it gets stretched
        // by the sides to fit all monitor space...

        // Try to setup the most appropriate fullscreen framebuffer for the requested screenWidth/screenHeight
        // It considers device display resolution mode and setups a framebuffer with black bars if required (render size/offset)
        // Modified global variables: CORE.Window.screen.width/CORE.Window.screen.height - CORE.Window.render.width/CORE.Window.render.height - CORE.Window.renderOffset.x/CORE.Window.renderOffset.y - CORE.Window.screenScale
        // TODO: It is a quite cumbersome solution to display size vs requested size, it should be reviewed or removed...
        // HighDPI monitors are properly considered in a following similar function: SetupViewport()
        SetupFramebuffer(CORE.Window.display.width, CORE.Window.display.height);

        platform.handle = glfwCreateWindow(CORE.Window.display.width, CORE.Window.display.height, (CORE.Window.title != 0)? CORE.Window.title : " ", monitor, NULL);

        // NOTE: Full-screen change, not working properly...
        //glfwSetWindowMonitor(platform.handle, glfwGetPrimaryMonitor(), 0, 0, CORE.Window.screen.width, CORE.Window.screen.height, GLFW_DONT_CARE);
    }
    else
    {
        // No-fullscreen window creation
        bool requestWindowedFullscreen = (CORE.Window.screen.height == 0) && (CORE.Window.screen.width == 0);

        // Default to at least one pixel in size, as creation with a zero dimension is not allowed.
        int creationWidth = CORE.Window.screen.width != 0 ? CORE.Window.screen.width : 1;
        int creationHeight = CORE.Window.screen.height != 0 ? CORE.Window.screen.height : 1;

        platform.handle = glfwCreateWindow(creationWidth, creationHeight, (CORE.Window.title != 0)? CORE.Window.title : " ", NULL, NULL);

        // After the window was created, determine the monitor that the window manager assigned.
        // Derive display sizes, and, if possible, window size in case it was zero at beginning.

        int monitorCount = 0;
        int monitorIndex = GetCurrentMonitor();
        GLFWmonitor **monitors = glfwGetMonitors(&monitorCount);

        if (monitorIndex < monitorCount)
        {
            monitor = monitors[monitorIndex];
            SetDimensionsFromMonitor(monitor);

            if (requestWindowedFullscreen) glfwSetWindowSize(platform.handle, CORE.Window.screen.width, CORE.Window.screen.height);
        }
        else
        {
            // The monitor for the window-manager-created window can not be determined, so it can not be centered.
            glfwTerminate();
            TRACELOG(LOG_WARNING, "GLFW: Failed to determine Monitor to center Window");
            return -1;
        }

        if (platform.handle)
        {
            CORE.Window.render.width = CORE.Window.screen.width;
            CORE.Window.render.height = CORE.Window.screen.height;
        }
    }

    if (!platform.handle)
    {
        glfwTerminate();
        TRACELOG(LOG_WARNING, "GLFW: Failed to initialize Window");
        return -1;
    }

    glfwMakeContextCurrent(platform.handle);
    result = glfwGetError(NULL);

    // Check context activation
    if ((result != GLFW_NO_WINDOW_CONTEXT) && (result != GLFW_PLATFORM_ERROR))
    {
        CORE.Window.ready = true;

        glfwSwapInterval(0);        // No V-Sync by default

        // Try to enable GPU V-Sync, so frames are limited to screen refresh rate (60Hz -> 60 FPS)
        // NOTE: V-Sync can be enabled by graphic driver configuration, it doesn't need
        // to be activated on web platforms since VSync is enforced there.
        if (CORE.Window.flags & FLAG_VSYNC_HINT)
        {
            // WARNING: It seems to hit a critical render path in Intel HD Graphics
            glfwSwapInterval(1);
            TRACELOG(LOG_INFO, "DISPLAY: Trying to enable VSYNC");
        }

        int fbWidth = CORE.Window.screen.width;
        int fbHeight = CORE.Window.screen.height;

        if ((CORE.Window.flags & FLAG_WINDOW_HIGHDPI) > 0)
        {
            // NOTE: On APPLE platforms system should manage window/input scaling and also framebuffer scaling.
            // Framebuffer scaling should be activated with: glfwWindowHint(GLFW_COCOA_RETINA_FRAMEBUFFER, GLFW_TRUE);
    #if !defined(__APPLE__)
            glfwGetFramebufferSize(platform.handle, &fbWidth, &fbHeight);

            // Screen scaling matrix is required in case desired screen area is different from display area
            CORE.Window.screenScale = MatrixScale((float)fbWidth/CORE.Window.screen.width, (float)fbHeight/CORE.Window.screen.height, 1.0f);

            // Mouse input scaling for the new screen size
            SetMouseScale((float)CORE.Window.screen.width/fbWidth, (float)CORE.Window.screen.height/fbHeight);
    #endif
        }

        CORE.Window.render.width = fbWidth;
        CORE.Window.render.height = fbHeight;
        CORE.Window.currentFbo.width = fbWidth;
        CORE.Window.currentFbo.height = fbHeight;

        TRACELOG(LOG_INFO, "DISPLAY: Device initialized successfully");
        TRACELOG(LOG_INFO, "    > Display size: %i x %i", CORE.Window.display.width, CORE.Window.display.height);
        TRACELOG(LOG_INFO, "    > Screen size:  %i x %i", CORE.Window.screen.width, CORE.Window.screen.height);
        TRACELOG(LOG_INFO, "    > Render size:  %i x %i", CORE.Window.render.width, CORE.Window.render.height);
        TRACELOG(LOG_INFO, "    > Viewport offsets: %i, %i", CORE.Window.renderOffset.x, CORE.Window.renderOffset.y);
    }
    else
    {
        TRACELOG(LOG_FATAL, "PLATFORM: Failed to initialize graphics device");
        return -1;
    }

    if ((CORE.Window.flags & FLAG_WINDOW_MINIMIZED) > 0) MinimizeWindow();

    // If graphic device is no properly initialized, we end program
    if (!CORE.Window.ready) { TRACELOG(LOG_FATAL, "PLATFORM: Failed to initialize graphic device"); return -1; }
    else
    {
        // Try to center window on screen but avoiding window-bar outside of screen
        int monitorX = 0;
        int monitorY = 0;
        int monitorWidth = 0;
        int monitorHeight = 0;
        glfwGetMonitorWorkarea(monitor, &monitorX, &monitorY, &monitorWidth, &monitorHeight);

        // Here CORE.Window.render.width/height should be used instead of CORE.Window.screen.width/height to center the window correctly when the high dpi flag is enabled.
        int posX = monitorX + (monitorWidth - (int)CORE.Window.render.width)/2;
        int posY = monitorY + (monitorHeight - (int)CORE.Window.render.height)/2;
        if (posX < monitorX) posX = monitorX;
        if (posY < monitorY) posY = monitorY;
        SetWindowPosition(posX, posY);

        // Update CORE.Window.position here so it is correct from the start
        CORE.Window.position.x = posX;
        CORE.Window.position.y = posY;
    }

    // Load OpenGL extensions
    // NOTE: GL procedures address loader is required to load extensions
    rlLoadExtensions(glfwGetProcAddress);
    //----------------------------------------------------------------------------

    // Initialize input events callbacks
    //----------------------------------------------------------------------------
    // Set window callback events
    glfwSetWindowSizeCallback(platform.handle, WindowSizeCallback);      // NOTE: Resizing not allowed by default!
    glfwSetWindowPosCallback(platform.handle, WindowPosCallback);
    glfwSetWindowMaximizeCallback(platform.handle, WindowMaximizeCallback);
    glfwSetWindowIconifyCallback(platform.handle, WindowIconifyCallback);
    glfwSetWindowFocusCallback(platform.handle, WindowFocusCallback);
    glfwSetDropCallback(platform.handle, WindowDropCallback);

    if ((CORE.Window.flags & FLAG_WINDOW_HIGHDPI) > 0)
    {
       glfwSetWindowContentScaleCallback(platform.handle, WindowContentScaleCallback);
    }

    // Set input callback events
    glfwSetKeyCallback(platform.handle, KeyCallback);
    glfwSetCharCallback(platform.handle, CharCallback);
    glfwSetMouseButtonCallback(platform.handle, MouseButtonCallback);
    glfwSetCursorPosCallback(platform.handle, MouseCursorPosCallback);   // Track mouse position changes
    glfwSetScrollCallback(platform.handle, MouseScrollCallback);
    glfwSetCursorEnterCallback(platform.handle, CursorEnterCallback);
    glfwSetJoystickCallback(JoystickCallback);

    glfwSetInputMode(platform.handle, GLFW_LOCK_KEY_MODS, GLFW_TRUE);    // Enable lock keys modifiers (CAPS, NUM)

    // Retrieve gamepad names
    for (int i = 0; i < MAX_GAMEPADS; i++)
    {
        if (glfwJoystickPresent(i)) strcpy(CORE.Input.Gamepad.name[i], glfwGetJoystickName(i));
    }
    //----------------------------------------------------------------------------

    // Initialize timming system
    //----------------------------------------------------------------------------
    InitTimer();
    //----------------------------------------------------------------------------

    // Initialize storage system
    //----------------------------------------------------------------------------
    CORE.Storage.basePath = GetWorkingDirectory();
    //----------------------------------------------------------------------------

#if defined(__NetBSD__)
    // Workaround for NetBSD
    char *glfwPlatform = "X11";
#else
    char *glfwPlatform = "";
    switch (glfwGetPlatform())
    {
        case GLFW_PLATFORM_WIN32: glfwPlatform = "Win32"; break;
        case GLFW_PLATFORM_COCOA: glfwPlatform = "Cocoa"; break;
        case GLFW_PLATFORM_WAYLAND: glfwPlatform = "Wayland"; break;
        case GLFW_PLATFORM_X11: glfwPlatform = "X11"; break;
        case GLFW_PLATFORM_NULL: glfwPlatform = "Null"; break;
        default: break;
    }
#endif

    TRACELOG(LOG_INFO, "PLATFORM: DESKTOP (GLFW - %s): Initialized successfully", glfwPlatform);

    return 0;
}